

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

IterateResult __thiscall VertexAttrib64Bit::LimitTest::iterate(LimitTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  
  iVar8 = (*((this->super_Base).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  memcpy(&(this->super_Base).gl,(void *)CONCAT44(extraout_var,iVar8),0x1a28);
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  testInit(this);
  bVar1 = testIteration(this,DOUBLE_DVEC2);
  bVar2 = testIteration(this,DVEC3_DVEC4);
  bVar3 = testIteration(this,DMAT2);
  bVar4 = testIteration(this,DMAT3X2_DMAT4X2);
  bVar5 = testIteration(this,DMAT2X3_DMAT2X4);
  bVar6 = testIteration(this,DMAT3_DMAT3X4);
  bVar7 = testIteration(this,DMAT4X3_DMAT4);
  Base::IterateStop(&this->super_Base,
                    (bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult LimitTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	testInit();

	if (false == testIteration(DOUBLE_DVEC2))
	{
		result = false;
	}

	if (false == testIteration(DVEC3_DVEC4))
	{
		result = false;
	}

	if (false == testIteration(DMAT2))
	{
		result = false;
	}

	if (false == testIteration(DMAT3X2_DMAT4X2))
	{
		result = false;
	}

	if (false == testIteration(DMAT2X3_DMAT2X4))
	{
		result = false;
	}

	if (false == testIteration(DMAT3_DMAT3X4))
	{
		result = false;
	}

	if (false == testIteration(DMAT4X3_DMAT4))
	{
		result = false;
	}

	/* Done */
	return IterateStop(result);
}